

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

double units::detail::cround_precise(double val)

{
  uint64_t bits;
  double val_local;
  
  return (double)((long)val + 0x800U & 0xfffffffffffff000);
}

Assistant:

inline double cround_precise(double val)
    {
#ifdef UNITS_NO_IEEE754
        int exp{0};
        auto f = frexp(val, &exp);
        f = round(f * 1e12);
        return ldexp(f * 1e-12, exp);
#else
        // what this is doing is assuming IEEE 754 floating point (double
        // precision) definition
        // taking 40 bits out of 52(roughly 10^12), adding 2^11 to do rounding
        // using memcpy to abide by strict aliasing rules
        // based on godbolt.org this gets compiled to 2 instructions + the
        // register loads
        std::uint64_t bits{0};
        std::memcpy(&bits, &val, sizeof(bits));
        bits += 0x800ULL;
        bits &= 0xFFFFFFFFFFFFF000ULL;
        std::memcpy(&val, &bits, sizeof(bits));
        return val;
#endif
    }